

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b-plus-tree.cpp
# Opt level: O1

void __thiscall BPTree::removeInternal(BPTree *this,keys_struct *x,Node *cursor,Node *child)

{
  vector<void_*,_std::allocator<void_*>_> *pvVar1;
  keys_struct *pkVar2;
  void *pvVar3;
  ostream *poVar4;
  Node *cursor_00;
  int iVar5;
  int iVar6;
  keys_struct *pkVar7;
  uint uVar8;
  Node **extraout_RDX;
  Node **ppNVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  Node *pNVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  pointer *pppvVar18;
  pointer ppvVar19;
  keys_struct local_70;
  keys_struct local_50;
  
  if ((this->root == cursor) && (cursor->size == 1)) {
    if (cursor->ptr[1] == child) {
      pkVar7 = child->key;
      if (pkVar7 != (keys_struct *)0x0) {
        ppvVar19 = pkVar7[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        pppvVar18 = &pkVar7[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage;
        if (ppvVar19 != (pointer)0x0) {
          lVar10 = (long)ppvVar19 << 5;
          do {
            pvVar3 = *(void **)((long)pkVar7 + lVar10 + -0x18);
            if (pvVar3 != (void *)0x0) {
              operator_delete(pvVar3,*(long *)((long)pppvVar18 + lVar10) - (long)pvVar3);
            }
            lVar10 = lVar10 + -0x20;
          } while (lVar10 != 0);
        }
        operator_delete__(pppvVar18,(long)ppvVar19 << 5 | 8);
      }
      if (child->ptr != (Node **)0x0) {
        operator_delete__(child->ptr);
      }
      if (child != (Node *)0x0) {
        operator_delete(child,0x20);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Deleted 1",9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      this->root = *cursor->ptr;
      pkVar7 = cursor->key;
      if (pkVar7 != (keys_struct *)0x0) {
        ppvVar19 = pkVar7[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        pppvVar18 = &pkVar7[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage;
        if (ppvVar19 != (pointer)0x0) {
          lVar10 = (long)ppvVar19 << 5;
          do {
            pvVar3 = *(void **)((long)pkVar7 + lVar10 + -0x18);
            if (pvVar3 != (void *)0x0) {
              operator_delete(pvVar3,*(long *)((long)pppvVar18 + lVar10) - (long)pvVar3);
            }
            lVar10 = lVar10 + -0x20;
          } while (lVar10 != 0);
        }
LAB_0011aea3:
        operator_delete__(pppvVar18,(long)ppvVar19 << 5 | 8);
      }
    }
    else {
      if (*cursor->ptr != child) goto LAB_0011a6f0;
      pkVar7 = child->key;
      if (pkVar7 != (keys_struct *)0x0) {
        ppvVar19 = pkVar7[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        pppvVar18 = &pkVar7[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage;
        if (ppvVar19 != (pointer)0x0) {
          lVar10 = (long)ppvVar19 << 5;
          do {
            pvVar3 = *(void **)((long)pkVar7 + lVar10 + -0x18);
            if (pvVar3 != (void *)0x0) {
              operator_delete(pvVar3,*(long *)((long)pppvVar18 + lVar10) - (long)pvVar3);
            }
            lVar10 = lVar10 + -0x20;
          } while (lVar10 != 0);
        }
        operator_delete__(pppvVar18,(long)ppvVar19 << 5 | 8);
      }
      if (child->ptr != (Node **)0x0) {
        operator_delete__(child->ptr);
      }
      if (child != (Node *)0x0) {
        operator_delete(child,0x20);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Deleted 1",9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      this->root = cursor->ptr[1];
      pkVar7 = cursor->key;
      if (pkVar7 != (keys_struct *)0x0) {
        ppvVar19 = pkVar7[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        pppvVar18 = &pkVar7[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage;
        if (ppvVar19 != (pointer)0x0) {
          lVar10 = (long)ppvVar19 << 5;
          do {
            pvVar3 = *(void **)((long)pkVar7 + lVar10 + -0x18);
            if (pvVar3 != (void *)0x0) {
              operator_delete(pvVar3,*(long *)((long)pppvVar18 + lVar10) - (long)pvVar3);
            }
            lVar10 = lVar10 + -0x20;
          } while (lVar10 != 0);
        }
        goto LAB_0011aea3;
      }
    }
    if (cursor->ptr != (Node **)0x0) {
      operator_delete__(cursor->ptr);
    }
    if (cursor != (Node *)0x0) {
      operator_delete(cursor,0x20);
    }
    poVar4 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Deleted 1",9);
    pcVar12 = "\n";
    lVar10 = 1;
LAB_0011aefd:
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar12,lVar10);
    return;
  }
LAB_0011a6f0:
  uVar14 = cursor->size;
  if ((int)uVar14 < 1) {
    uVar15 = 0;
  }
  else {
    pkVar7 = cursor->key;
    uVar15 = 0;
    do {
      if ((pkVar7->key_value == x->key_value) && (!NAN(pkVar7->key_value) && !NAN(x->key_value)))
      goto LAB_0011a723;
      uVar15 = uVar15 + 1;
      pkVar7 = pkVar7 + 1;
    } while (uVar14 != uVar15);
    uVar15 = (ulong)uVar14;
  }
LAB_0011a723:
  iVar6 = cursor->size;
  if ((int)uVar15 < iVar6) {
    lVar10 = (uVar15 & 0xffffffff) * 0x20 + 0x28;
    do {
      pkVar7 = cursor->key;
      *(undefined4 *)((long)pkVar7 + lVar10 + -0x28) = *(undefined4 *)((long)pkVar7 + lVar10 + -8);
      std::vector<void_*,_std::allocator<void_*>_>::operator=
                ((vector<void_*,_std::allocator<void_*>_> *)((long)&pkVar7[-1].key_value + lVar10),
                 (vector<void_*,_std::allocator<void_*>_> *)((long)&pkVar7->key_value + lVar10));
      iVar6 = cursor->size;
      lVar10 = lVar10 + 0x20;
      uVar14 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar14;
    } while ((int)uVar14 < iVar6);
  }
  if (iVar6 < 0) {
    uVar15 = 0;
  }
  else {
    uVar15 = (ulong)(iVar6 + 1);
    uVar11 = 0;
    do {
      if (cursor->ptr[uVar11] == child) {
        uVar15 = uVar11 & 0xffffffff;
        break;
      }
      uVar11 = uVar11 + 1;
    } while (uVar15 != uVar11);
  }
  if ((int)uVar15 <= iVar6) {
    iVar5 = (int)uVar15 + -1;
    do {
      cursor->ptr[uVar15] = cursor->ptr[uVar15 + 1];
      iVar5 = iVar5 + 1;
      uVar15 = uVar15 + 1;
    } while (iVar5 < iVar6);
  }
  cursor->size = iVar6 + -1;
  if (2 < iVar6) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Deleted ",8);
    poVar4 = std::ostream::_M_insert<double>((ostream *)&std::cout,(double)x->key_value);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    pcVar12 = " from internal node successfully\n";
    lVar10 = 0x21;
    goto LAB_0011aefd;
  }
  if (this->root == cursor) {
    return;
  }
  cursor_00 = findParent(this,this->root,cursor);
  uVar14 = cursor_00->size;
  uVar15 = (ulong)uVar14;
  if ((int)uVar14 < 0) {
    uVar14 = 0;
    ppNVar9 = extraout_RDX;
  }
  else {
    ppNVar9 = cursor_00->ptr;
    uVar14 = uVar14 + 1;
    uVar15 = uVar15 + 1;
    uVar11 = 0;
    do {
      if (ppNVar9[uVar11] == cursor) {
        uVar14 = (uint)uVar11;
        uVar8 = uVar14 - 1;
        iVar6 = uVar14 + 1;
        goto LAB_0011a84f;
      }
      uVar11 = uVar11 + 1;
    } while (uVar15 != uVar11);
  }
  iVar6 = (int)uVar15;
  uVar8 = (uint)ppNVar9;
LAB_0011a84f:
  if (-1 < (int)uVar8) {
    pNVar13 = cursor_00->ptr[uVar8];
    if (2 < pNVar13->size) {
      lVar10 = (long)cursor->size;
      if (0 < lVar10) {
        lVar16 = lVar10 + 1;
        uVar15 = lVar10 << 5 | 8;
        do {
          pkVar7 = cursor->key;
          *(undefined4 *)((long)pkVar7 + (uVar15 - 8)) =
               *(undefined4 *)((long)pkVar7 + (uVar15 - 0x28));
          std::vector<void_*,_std::allocator<void_*>_>::operator=
                    ((vector<void_*,_std::allocator<void_*>_> *)((long)&pkVar7->key_value + uVar15),
                     (vector<void_*,_std::allocator<void_*>_> *)
                     ((long)&pkVar7[-1].key_value + uVar15));
          lVar16 = lVar16 + -1;
          uVar15 = uVar15 - 0x20;
        } while (1 < lVar16);
      }
      pkVar7 = cursor_00->key;
      pkVar2 = cursor->key;
      pkVar2->key_value = pkVar7[uVar8].key_value;
      std::vector<void_*,_std::allocator<void_*>_>::operator=
                (&pkVar2->add_vect,&pkVar7[uVar8].add_vect);
      pkVar7 = pNVar13->key;
      iVar6 = pNVar13->size;
      pkVar2 = cursor_00->key;
      pkVar2[uVar8].key_value = pkVar7[(long)iVar6 + -1].key_value;
      std::vector<void_*,_std::allocator<void_*>_>::operator=
                (&pkVar2[uVar8].add_vect,&pkVar7[(long)iVar6 + -1].add_vect);
      iVar6 = cursor->size;
      uVar14 = iVar6 + 1;
      if (-1 < iVar6) {
        uVar15 = (ulong)uVar14;
        iVar6 = iVar6 + 2;
        do {
          cursor->ptr[uVar15] = cursor->ptr[uVar15 - 1];
          uVar15 = uVar15 - 1;
          iVar6 = iVar6 + -1;
        } while (1 < iVar6);
      }
      *cursor->ptr = pNVar13->ptr[pNVar13->size];
      goto LAB_0011ada6;
    }
  }
  if ((cursor_00->size < iVar6) || (pNVar13 = cursor_00->ptr[iVar6], pNVar13->size < 3)) {
    if ((int)uVar8 < 0) {
      if (cursor_00->size < iVar6) {
        return;
      }
      pkVar7 = cursor_00->key;
      pNVar13 = cursor_00->ptr[iVar6];
      lVar10 = (long)iVar6 + -1;
      pkVar2 = cursor->key;
      iVar6 = cursor->size;
      pkVar2[iVar6].key_value = pkVar7[lVar10].key_value;
      std::vector<void_*,_std::allocator<void_*>_>::operator=
                (&pkVar2[iVar6].add_vect,&pkVar7[lVar10].add_vect);
      iVar6 = pNVar13->size;
      if (0 < iVar6) {
        iVar5 = cursor->size;
        lVar17 = 8;
        lVar16 = 0;
        do {
          pkVar7 = pNVar13->key;
          pkVar2 = cursor->key;
          pkVar2[(long)iVar5 + 1].key_value = *(float *)((long)pkVar7 + lVar17 + -8);
          std::vector<void_*,_std::allocator<void_*>_>::operator=
                    (&pkVar2[(long)iVar5 + 1].add_vect,
                     (vector<void_*,_std::allocator<void_*>_> *)((long)&pkVar7->key_value + lVar17))
          ;
          lVar16 = lVar16 + 1;
          iVar6 = pNVar13->size;
          lVar17 = lVar17 + 0x20;
        } while (lVar16 < iVar6);
      }
      iVar5 = cursor->size;
      if (-1 < iVar6) {
        uVar15 = 0;
        do {
          cursor->ptr[(long)iVar5 + 1] = pNVar13->ptr[uVar15];
          pNVar13->ptr[uVar15] = (Node *)0x0;
          uVar15 = uVar15 + 1;
        } while (iVar6 + 1 != uVar15);
      }
      cursor->size = iVar6 + iVar5 + 1;
      pNVar13->size = 0;
      pvVar1 = &cursor_00->key[lVar10].add_vect;
      local_70.key_value = *(float *)((long)(pvVar1 + -1) + 0x10);
      std::vector<void_*,_std::allocator<void_*>_>::vector(&local_70.add_vect,pvVar1);
      removeInternal(this,&local_70,cursor_00,pNVar13);
    }
    else {
      pkVar7 = cursor_00->key;
      pNVar13 = cursor_00->ptr[uVar8];
      pkVar2 = pNVar13->key;
      iVar6 = pNVar13->size;
      pkVar2[iVar6].key_value = pkVar7[uVar8].key_value;
      std::vector<void_*,_std::allocator<void_*>_>::operator=
                (&pkVar2[iVar6].add_vect,&pkVar7[uVar8].add_vect);
      iVar6 = cursor->size;
      if (0 < iVar6) {
        iVar5 = pNVar13->size;
        lVar16 = 8;
        lVar10 = 0;
        do {
          pkVar7 = cursor->key;
          pkVar2 = pNVar13->key;
          pkVar2[(long)iVar5 + 1].key_value = *(float *)((long)pkVar7 + lVar16 + -8);
          std::vector<void_*,_std::allocator<void_*>_>::operator=
                    (&pkVar2[(long)iVar5 + 1].add_vect,
                     (vector<void_*,_std::allocator<void_*>_> *)((long)&pkVar7->key_value + lVar16))
          ;
          lVar10 = lVar10 + 1;
          iVar6 = cursor->size;
          lVar16 = lVar16 + 0x20;
        } while (lVar10 < iVar6);
      }
      iVar5 = pNVar13->size;
      if (-1 < iVar6) {
        uVar15 = 0;
        do {
          pNVar13->ptr[(long)iVar5 + 1] = cursor->ptr[uVar15];
          cursor->ptr[uVar15] = (Node *)0x0;
          uVar15 = uVar15 + 1;
        } while (iVar6 + 1 != uVar15);
      }
      pNVar13->size = iVar6 + iVar5 + 1;
      cursor->size = 0;
      pvVar1 = &cursor_00->key[uVar8].add_vect;
      local_50.key_value = *(float *)((long)(pvVar1 + -1) + 0x10);
      std::vector<void_*,_std::allocator<void_*>_>::vector(&local_50.add_vect,pvVar1);
      removeInternal(this,&local_50,cursor_00,cursor);
      local_70.add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_50.add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_70.add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_50.add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
    }
    if (local_70.add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      return;
    }
    operator_delete(local_70.add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    return;
  }
  pkVar7 = cursor_00->key;
  pkVar2 = cursor->key;
  iVar6 = cursor->size;
  pkVar2[iVar6].key_value = pkVar7[uVar14].key_value;
  std::vector<void_*,_std::allocator<void_*>_>::operator=
            (&pkVar2[iVar6].add_vect,&pkVar7[uVar14].add_vect);
  pkVar7 = pNVar13->key;
  pkVar2 = cursor_00->key;
  pkVar2[uVar14].key_value = pkVar7->key_value;
  std::vector<void_*,_std::allocator<void_*>_>::operator=
            (&pkVar2[uVar14].add_vect,&pkVar7->add_vect);
  uVar14 = pNVar13->size;
  if (1 < (int)uVar14) {
    lVar10 = 0x28;
    lVar16 = 0;
    do {
      pkVar7 = pNVar13->key;
      lVar16 = lVar16 + 1;
      *(undefined4 *)((long)pkVar7 + lVar10 + -0x28) = *(undefined4 *)((long)pkVar7 + lVar10 + -8);
      std::vector<void_*,_std::allocator<void_*>_>::operator=
                ((vector<void_*,_std::allocator<void_*>_> *)((long)&pkVar7[-1].key_value + lVar10),
                 (vector<void_*,_std::allocator<void_*>_> *)((long)&pkVar7->key_value + lVar10));
      uVar14 = pNVar13->size;
      lVar10 = lVar10 + 0x20;
    } while (lVar16 < (long)(int)uVar14 + -1);
  }
  iVar6 = cursor->size;
  cursor->ptr[(long)iVar6 + 1] = *pNVar13->ptr;
  if (0 < (int)uVar14) {
    uVar15 = 0;
    do {
      pNVar13->ptr[uVar15] = pNVar13->ptr[uVar15 + 1];
      uVar15 = uVar15 + 1;
    } while (uVar14 != uVar15);
  }
  uVar14 = iVar6 + 1;
LAB_0011ada6:
  cursor->size = uVar14;
  pNVar13->size = pNVar13->size + -1;
  return;
}

Assistant:

void removeInternal(keys_struct x, Node* cursor, Node* child)
    {
        //deleting the key x first
        //checking if key from root is to be deleted
        if(cursor == root)
        {
            if(cursor->size == 1)//if only one key is left, change root
            {
                if(cursor->ptr[1] == child)
                {
                    delete[] child->key;
                    delete[] child->ptr;
                    delete child;
                    cout << "Deleted 1" <<"\n";
                    root = cursor->ptr[0];
                    delete[] cursor->key;
                    delete[] cursor->ptr;
                    delete cursor;
                    cout << "Deleted 1" <<"\n";
                    //cout<<"Changed root node\n";
                    return;
                }
                else if(cursor->ptr[0] == child)
                {
                    delete[] child->key;
                    delete[] child->ptr;
                    delete child;
                    cout << "Deleted 1" <<"\n";
                    root = cursor->ptr[1];
                    delete[] cursor->key;
                    delete[] cursor->ptr;
                    delete cursor;
                    cout << "Deleted 1" <<"\n";
                    //cout<<"Changed root node\n";
                    return;
                }
            }
        }
        int pos;
        for(pos = 0; pos < cursor->size; pos++)
        {
            if(cursor->key[pos].key_value == x.key_value)
            {
                break;
            }
        }
        for(int i = pos; i < cursor->size; i++)
        {
            cursor->key[i] = cursor->key[i+1];
        }
        //now deleting the pointer child
        for(pos = 0; pos < cursor->size+1; pos++)
        {
            if(cursor->ptr[pos] == child)
            {
                break;
            }
        }
        for(int i = pos; i < cursor->size+1; i++)
        {
            cursor->ptr[i] = cursor->ptr[i+1];
        }
        cursor->size--;
        if(cursor->size >= (MAX+1)/2-1)//no underflow
        {
            cout<<"Deleted "<< x.key_value << " " <<" from internal node successfully\n";
            return;
        }
        //cout<<"Underflow in internal node!\n";
        //underflow, try to transfer first
        if(cursor==root)return;
        Node* parent = findParent(root, cursor);
        int leftSibling, rightSibling;
        //finding left n right sibling of cursor
        for(pos = 0; pos < parent->size+1; pos++)
        {
            if(parent->ptr[pos] == cursor)
            {
                leftSibling = pos - 1;
                rightSibling = pos + 1;
                break;
            }
        }
        //try to transfer
        if(leftSibling >= 0)//if left sibling exists
        {
            Node *leftNode = parent->ptr[leftSibling];
            //check if it is possible to transfer
            if(leftNode->size >= (MAX+1)/2)
            {
                //make space for transfer of key
                for(int i = cursor->size; i > 0; i--)
                {
                    cursor->key[i] = cursor->key[i-1];
                }
                //transfer key from left sibling through parent
                cursor->key[0] = parent->key[leftSibling];
                parent->key[leftSibling] = leftNode->key[leftNode->size-1];
                //transfer last pointer from leftnode to cursor
                //make space for transfer of ptr
                for (int i = cursor->size+1; i > 0; i--)
                {
                    cursor->ptr[i] = cursor->ptr[i-1];
                }
                //transfer ptr
                cursor->ptr[0] = leftNode->ptr[leftNode->size];
                cursor->size++;
                leftNode->size--;
                //cout<<"Transferred "<<cursor->key[0].key_value<<" "<< x.add_vect[0] <<" from left sibling of internal node\n";
                return;
            }
        }
        if(rightSibling <= parent->size)//check if right sibling exist
        {
            Node *rightNode = parent->ptr[rightSibling];
            //check if it is possible to transfer
            if(rightNode->size >= (MAX+1)/2)
            {
                //transfer key from right sibling through parent
                cursor->key[cursor->size] = parent->key[pos];
                parent->key[pos] = rightNode->key[0];
                for (int i = 0; i < rightNode->size -1; i++)
                {
                    rightNode->key[i] = rightNode->key[i+1];
                }
                //transfer first pointer from rightnode to cursor
                //transfer ptr
                cursor->ptr[cursor->size+1] = rightNode->ptr[0];
                for (int i = 0; i < rightNode->size; ++i)
                {
                    rightNode->ptr[i] = rightNode->ptr[i+1];
                }
                cursor->size++;
                rightNode->size--;
                //cout<<"Transferred "<<cursor->key[0].key_value << " " << x.add_vect[0] <<" from right sibling of internal node\n";
                return;
            }
        }
        //transfer wasnt posssible hence do merging
        if(leftSibling >= 0)
        {
            //leftnode + parent key + cursor
            Node *leftNode = parent->ptr[leftSibling];
            leftNode->key[leftNode->size] = parent->key[leftSibling];
            for(int i = leftNode->size+1, j = 0; j < cursor->size; j++)
            {
                leftNode->key[i] = cursor->key[j];
            }
            for(int i = leftNode->size+1, j = 0; j < cursor->size+1; j++)
            {
                leftNode->ptr[i] = cursor->ptr[j];
                cursor->ptr[j] = NULL;
            }
            leftNode->size += cursor->size+1;
            cursor->size = 0;
            //delete cursor
            removeInternal(parent->key[leftSibling], parent, cursor);
            //cout<<"Merged with left sibling\n";

        }
        else if(rightSibling <= parent->size)
        {
            //cursor + parent key + rightnode
            Node *rightNode = parent->ptr[rightSibling];
            cursor->key[cursor->size] = parent->key[rightSibling-1];
            for(int i = cursor->size+1, j = 0; j < rightNode->size; j++)
            {
                cursor->key[i] = rightNode->key[j];
            }
            for(int i = cursor->size+1, j = 0; j < rightNode->size+1; j++)
            {
                cursor->ptr[i] = rightNode->ptr[j];
                rightNode->ptr[j] = NULL;
            }
            cursor->size += rightNode->size+1;
            rightNode->size = 0;
            //delete cursor
            removeInternal(parent->key[rightSibling-1], parent, rightNode);
            //cout<<"Merged with right sibling\n";
        }
    }